

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O0

void __thiscall BamTools::ConvertTool::ConvertTool(ConvertTool *this)

{
  _func_int **pp_Var1;
  OptionGroup *group;
  string *valueDescription;
  OptionGroup *group_00;
  OptionGroup *pOVar2;
  AbstractTool *in_RDI;
  OptionGroup *SamOpts;
  OptionGroup *PileupOpts;
  OptionGroup *IO_Opts;
  string *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  ConvertSettings *in_stack_fffffffffffff920;
  allocator *paVar3;
  string *in_stack_fffffffffffff940;
  string *psVar4;
  allocator *foundArgument;
  string *optionDescription;
  string *argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *valueTypeDescription;
  string *optionDescription_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f8;
  string *valueDescription_00;
  string *argument_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *valueTypeDescription_00;
  OptionGroup *group_01;
  string *argument_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue;
  allocator local_579;
  string local_578 [39];
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  OptionGroup *local_508;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  undefined1 local_459 [40];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  OptionGroup *local_3e8;
  allocator local_3d9;
  string local_3d8 [39];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  undefined1 local_271 [40];
  undefined1 local_249 [40];
  undefined1 local_221 [40];
  allocator local_1f9;
  string local_1f8 [39];
  undefined1 local_1d1 [40];
  undefined1 local_1a9 [40];
  undefined1 local_181 [40];
  undefined1 local_159 [40];
  undefined1 local_131 [40];
  undefined1 local_109 [40];
  undefined1 local_e1 [40];
  undefined1 local_b9 [33];
  OptionGroup *local_98;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [56];
  
  AbstractTool::AbstractTool(in_RDI);
  in_RDI->_vptr_AbstractTool = (_func_int **)&PTR__ConvertTool_0033ebb8;
  pp_Var1 = (_func_int **)operator_new(0xc0);
  ConvertSettings::ConvertSettings(in_stack_fffffffffffff920);
  in_RDI[1]._vptr_AbstractTool = pp_Var1;
  in_RDI[2]._vptr_AbstractTool = (_func_int **)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"bamtools convert",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"converts BAM to a number of other formats",&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "-format <FORMAT> [-in <filename> -in <filename> ... | -list <filelist>] [-out <filename>] [-region <REGION>] [format-specific options]"
             ,&local_89);
  Options::SetProgramInfo(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,(string *)0x1f47ce);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  defaultValue = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b9 + 1),"Input & Output",(allocator *)defaultValue);
  group = Options::CreateOptionGroup(in_stack_fffffffffffff940);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e1;
  local_98 = group;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"-in",(allocator *)pbVar5);
  pOVar2 = (OptionGroup *)local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_109 + 1),"BAM filename",(allocator *)pOVar2);
  psVar4 = (string *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_131 + 1),"the input BAM file(s)",(allocator *)psVar4);
  argument_01 = (string *)local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_159 + 1),"",(allocator *)argument_01);
  argument_00 = (string *)in_RDI[1]._vptr_AbstractTool;
  valueTypeDescription_00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &argument_00->_M_string_length;
  group_01 = local_98;
  valueDescription = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (argument_01,valueDescription,&group_01->Name,valueTypeDescription_00,
             (bool *)argument_00,in_stack_fffffffffffff9f8,pOVar2,pbVar5);
  std::__cxx11::string::~string((string *)(local_159 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_159);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  std::__cxx11::string::~string((string *)(local_109 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_109);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  valueDescription_00 = (string *)local_181;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_181 + 1),"-list",(allocator *)valueDescription_00);
  optionDescription_00 = (string *)local_1a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1a9 + 1),"filename",(allocator *)optionDescription_00);
  valueTypeDescription = (string *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1d1 + 1),"the input BAM file list, one line per file",
             (allocator *)valueTypeDescription);
  paVar3 = &local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"",paVar3);
  Options::AddValueOption<std::__cxx11::string>
            (argument_00,valueDescription_00,optionDescription_00,valueTypeDescription,
             (bool *)paVar3,in_stack_fffffffffffff9d8,group_01);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  std::__cxx11::string::~string((string *)(local_1a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1a9);
  std::__cxx11::string::~string((string *)(local_181 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_181);
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_221 + 1),"-out",(allocator *)pbVar5);
  argument = (string *)local_249;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_249 + 1),"BAM filename",(allocator *)argument);
  optionDescription = (string *)local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_271 + 1),"the output BAM file",(allocator *)optionDescription);
  foundArgument = &local_299;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"",foundArgument);
  group_00 = (OptionGroup *)Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&pOVar2->Name,psVar4,argument_01,valueDescription,(bool *)group_01,
             valueTypeDescription_00,group,defaultValue);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string((string *)(local_271 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_271);
  std::__cxx11::string::~string((string *)(local_249 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_249);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"-format",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"FORMAT",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_310,"the output file format - see README for recognized formats",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"",&local_339);
  Options::AddValueOption<std::__cxx11::string>
            (argument_00,valueDescription_00,optionDescription_00,valueTypeDescription,
             (bool *)paVar3,pbVar5,group_01);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"-region",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"REGION",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3b0,
             "genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"",&local_3d9);
  Options::AddValueOption<std::__cxx11::string>
            (argument_00,valueDescription_00,optionDescription_00,valueTypeDescription,
             (bool *)paVar3,pbVar5,group_01);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_408,"Pileup Options",&local_409);
  pOVar2 = Options::CreateOptionGroup(in_stack_fffffffffffff940);
  std::__cxx11::string::~string(local_408);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  local_3e8 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_430,"-fasta",&local_431);
  psVar4 = (string *)local_459;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_459 + 1),"FASTA filename",(allocator *)psVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_480,"FASTA reference file",&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a8,"",&local_4a9);
  Options::AddValueOption<std::__cxx11::string>
            (argument_00,valueDescription_00,optionDescription_00,valueTypeDescription,
             (bool *)paVar3,pbVar5,group_01);
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::__cxx11::string::~string((string *)(local_459 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_459);
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"-mapqual",&local_4d1);
  paVar3 = &local_4f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"print the mapping qualities",paVar3);
  Options::AddOption(argument,optionDescription,(bool *)foundArgument,group_00);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"SAM Options",&local_529);
  pOVar2 = Options::CreateOptionGroup(psVar4);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  local_508 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"-noheader",&local_551);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"omit the SAM header from output",&local_579);
  Options::AddOption(argument,optionDescription,(bool *)foundArgument,group_00);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  return;
}

Assistant:

ConvertTool::ConvertTool()
    : AbstractTool()
    , m_settings(new ConvertSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools convert", "converts BAM to a number of other formats",
                            "-format <FORMAT> [-in <filename> -in <filename> ... | -list "
                            "<filelist>] [-out <filename>] [-region <REGION>] [format-specific "
                            "options]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file(s)", "",
                            m_settings->HasInput, m_settings->InputFiles, IO_Opts,
                            Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts,
                            Options::StandardOut());
    Options::AddValueOption("-format", "FORMAT",
                            "the output file format - see README for recognized formats", "",
                            m_settings->HasFormat, m_settings->Format, IO_Opts);
    Options::AddValueOption("-region", "REGION",
                            "genomic region. Index file is recommended for better performance, and "
                            "is used automatically if it exists. See \'bamtools help index\' for "
                            "more details on creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);

    OptionGroup* PileupOpts = Options::CreateOptionGroup("Pileup Options");
    Options::AddValueOption("-fasta", "FASTA filename", "FASTA reference file", "",
                            m_settings->HasFastaFilename, m_settings->FastaFilename, PileupOpts);
    Options::AddOption("-mapqual", "print the mapping qualities",
                       m_settings->IsPrintingPileupMapQualities, PileupOpts);

    OptionGroup* SamOpts = Options::CreateOptionGroup("SAM Options");
    Options::AddOption("-noheader", "omit the SAM header from output",
                       m_settings->IsOmittingSamHeader, SamOpts);
}